

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall dh::analysis::genMidCode(analysis *this)

{
  bool bVar1;
  ostream *this_00;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [32];
  analysis *local_10;
  analysis *this_local;
  
  local_10 = this;
  if ((this->initFlag & 1U) != 0) {
    while( true ) {
      std::__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &this->current_tab);
      symTab::get_upptr_tab((symTab *)(local_30 + 0x10));
      bVar1 = std::operator!=((shared_ptr<dh::symTab> *)(local_30 + 0x10),(nullptr_t)0x0);
      std::shared_ptr<dh::symTab>::~shared_ptr((shared_ptr<dh::symTab> *)(local_30 + 0x10));
      if (!bVar1) break;
      std::__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &this->current_tab);
      symTab::get_upptr_tab((symTab *)local_30);
      std::shared_ptr<dh::symTab>::operator=(&this->current_tab,(shared_ptr<dh::symTab> *)local_30);
      std::shared_ptr<dh::symTab>::~shared_ptr((shared_ptr<dh::symTab> *)local_30);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    genMidCode(this,&this->_root,(string *)local_50,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this->genFlag = true;
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"[Fatal] SynTree not ready");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void analysis::genMidCode()
{
	if ( !initFlag)
	{
		::std::cerr << "[Fatal] SynTree not ready" << ::std::endl;
		::std::exit(1);
	}

	while ( current_tab->get_upptr_tab() != nullptr)
	{
		current_tab = current_tab->get_upptr_tab();
	}
	genMidCode( _root, "", "");
	genFlag = true;
}